

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_seg.c
# Opt level: O0

int mk_seg(acmod_set_t *acmod_set,uint16 *seg,uint32 n_frame,acmod_id_t *phone,uint32 *start,
          uint32 *len,uint32 n_phone)

{
  bool bVar1;
  uint local_40;
  uint local_3c;
  uint32 f;
  uint32 phone_i;
  uint32 *len_local;
  uint32 *start_local;
  acmod_id_t *phone_local;
  uint32 n_frame_local;
  uint16 *seg_local;
  acmod_set_t *acmod_set_local;
  
  local_3c = 0;
  local_40 = 0;
  while( true ) {
    if (n_phone <= local_3c) {
      return 0;
    }
    if ((seg[local_40] & 0x8000) == 0) break;
    start[local_3c] = local_40;
    do {
      local_40 = local_40 + 1;
      bVar1 = false;
      if (local_40 < n_frame) {
        bVar1 = (seg[local_40] & 0x8000) == 0;
      }
    } while (bVar1);
    len[local_3c] = local_40 - start[local_3c];
    local_3c = local_3c + 1;
  }
  __assert_fail("seg[f] & 0x8000",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/mk_seg.c"
                ,0x47,
                "int mk_seg(acmod_set_t *, uint16 *, uint32, acmod_id_t *, uint32 *, uint32 *, uint32)"
               );
}

Assistant:

int
mk_seg(acmod_set_t *acmod_set,
       uint16 *seg,
       uint32 n_frame,
       acmod_id_t *phone,
       uint32 *start,
       uint32 *len,
       uint32 n_phone)
{
    uint32 phone_i;
    uint32 f;

    /*
     * BEWARE: This routine does not check the consistency of
     *		phone[] with seg[].  See ck_seg() for this test.
     */
       

    for (phone_i = 0, f = 0; phone_i < n_phone; phone_i++) {
	assert(seg[f] & 0x8000);	/* beginning of phone bit */
	
	start[phone_i] = f;
	
	/* skip over the remaining frames in the segment */
	for (++f; (f < n_frame) && !(seg[f] & 0x8000); f++);
	
	len[phone_i] = f - start[phone_i];
    }
	
    return S3_SUCCESS;
}